

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

ImGuiStoragePair * __thiscall
ImVector<ImGuiStorage::ImGuiStoragePair>::insert
          (ImVector<ImGuiStorage::ImGuiStoragePair> *this,ImGuiStoragePair *it,ImGuiStoragePair *v)

{
  anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 aVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int new_capacity;
  ImGuiStoragePair *pIVar6;
  
  pIVar6 = this->Data;
  lVar5 = (long)it - (long)pIVar6;
  iVar3 = this->Size;
  if (iVar3 == this->Capacity) {
    if (iVar3 == 0) {
      iVar2 = 8;
    }
    else {
      iVar2 = iVar3 / 2 + iVar3;
    }
    new_capacity = iVar3 + 1;
    if (iVar3 + 1 < iVar2) {
      new_capacity = iVar2;
    }
    reserve(this,new_capacity);
    iVar3 = this->Size;
    pIVar6 = this->Data;
  }
  lVar4 = (long)iVar3 - (lVar5 >> 4);
  if (lVar4 != 0 && lVar5 >> 4 <= (long)iVar3) {
    memmove((void *)((long)pIVar6 + lVar5 + 0x10),(void *)((long)pIVar6 + lVar5),lVar4 * 0x10);
    pIVar6 = this->Data;
  }
  aVar1 = v->field_1;
  *(undefined8 *)((long)pIVar6 + lVar5) = *(undefined8 *)v;
  *(anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 *)((undefined8 *)((long)pIVar6 + lVar5) + 1) =
       aVar1;
  this->Size = this->Size + 1;
  return (ImGuiStoragePair *)(lVar5 + (long)this->Data);
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data + Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }